

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O1

int lookup_trace(char *chipset,char *event)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  uint *__ptr;
  rnndecaddrinfo *a;
  uint *puVar5;
  long lVar6;
  long lVar7;
  uint32_t mask;
  uint32_t value;
  uint32_t addr;
  char buf [1024];
  char cmd [1024];
  uint local_848;
  uint local_844;
  uint local_840;
  uint local_83c;
  char local_838 [1024];
  char local_438 [1032];
  
  sprintf(local_438,
          "demmt -l %s.trace -m %s -d all -e nvrm-mthd=0x20800122  -e ioctl-desc 2> /dev/null | grep dir > %s.demmt"
          ,event,chipset,event);
  pFVar3 = popen(local_438,"r");
  if (pFVar3 == (FILE *)0x0) {
LAB_001027d6:
    lookup_trace_cold_2();
    return 1;
  }
  pcVar4 = fgets(local_838,0x400,pFVar3);
  if (pcVar4 != (char *)0x0) {
    do {
      printf("%s",local_838);
      pcVar4 = fgets(local_838,0x400,pFVar3);
    } while (pcVar4 != (char *)0x0);
  }
  iVar2 = pclose(pFVar3);
  if (iVar2 < 0) goto LAB_001027d6;
  sprintf(local_838,"%s.demmt",event);
  pFVar3 = fopen(local_838,"r");
  if (pFVar3 == (FILE *)0x0) {
    pcVar4 = "fopen";
  }
  else {
    __ptr = (uint *)calloc(1,0x8004);
    if (__ptr != (uint *)0x0) {
      pcVar4 = fgets(local_438,0x400,pFVar3);
      if (pcVar4 != (char *)0x0) {
        do {
          pcVar4 = strstr(local_438,"dir:");
          if (pcVar4 == (char *)0x0) {
LAB_001027b4:
            fclose(pFVar3);
            free(__ptr);
            goto LAB_00102802;
          }
          __isoc99_sscanf(pcVar4 + 5,"0x%08x",&local_848);
          pcVar4 = strstr(local_438,"mmio:");
          if (pcVar4 == (char *)0x0) goto LAB_001027b4;
          __isoc99_sscanf(pcVar4 + 6,"0x%08x",&local_83c);
          pcVar4 = strstr(local_438,"value:");
          if (pcVar4 == (char *)0x0) goto LAB_001027b4;
          __isoc99_sscanf(pcVar4 + 7,"0x%08x",&local_840);
          pcVar4 = strstr(local_438,"mask:");
          if (pcVar4 == (char *)0x0) goto LAB_001027b4;
          __isoc99_sscanf(pcVar4 + 6,"0x%08x",&local_844);
          lVar6 = (long)(int)__ptr[0x2000];
          if (0 < lVar6) {
            lVar7 = 0;
            do {
              if ((((*(uint *)((long)__ptr + lVar7) == local_848) &&
                   (*(uint *)((long)__ptr + lVar7 + 4) == local_83c)) &&
                  (*(uint *)((long)__ptr + lVar7 + 8) == local_840)) &&
                 (*(uint *)((long)__ptr + lVar7 + 0xc) == local_844)) goto LAB_00102791;
              lVar7 = lVar7 + 0x10;
            } while (lVar6 << 4 != lVar7);
          }
          __ptr[0x2000] = __ptr[0x2000] + 1;
          __ptr[lVar6 * 4] = local_848;
          __ptr[lVar6 * 4 + 1] = local_83c;
          __ptr[lVar6 * 4 + 3] = local_844;
          __ptr[lVar6 * 4 + 2] = local_840;
LAB_00102791:
          pcVar4 = fgets(local_438,0x400,pFVar3);
        } while (pcVar4 != (char *)0x0);
      }
      fclose(pFVar3);
      goto LAB_00102805;
    }
    pcVar4 = "malloc";
  }
  perror(pcVar4);
LAB_00102802:
  __ptr = (uint *)0x0;
LAB_00102805:
  if (__ptr == (uint *)0x0) {
    return 1;
  }
  if (0 < (int)__ptr[0x2000]) {
    lVar6 = 0;
    puVar5 = __ptr;
    do {
      printf("(%c) register: %06x, value: %08x, mask: %08x ",(ulong)((*puVar5 & 1) * 5 + 0x72),
             (ulong)puVar5[1],(ulong)puVar5[2],(ulong)puVar5[3]);
      pcVar4 = "<==";
      if ((*puVar5 & 1) == 0) {
        pcVar4 = "==>";
      }
      printf("%s ",pcVar4);
      uVar1 = puVar5[2];
      a = rnndec_decodeaddr(rnnctx,rnndom,(ulong)puVar5[1],0);
      if (a == (rnndecaddrinfo *)0x0) {
LAB_00102909:
        lookup_trace_cold_1();
        return 1;
      }
      if (a->typeinfo == (rnntypeinfo *)0x0) {
        puts(a->name);
      }
      else {
        pcVar4 = rnndec_decodeval(rnnctx,a->typeinfo,(ulong)uVar1,a->width);
        printf("%s => %s\n",a->name,pcVar4);
        free(pcVar4);
      }
      rnndec_free_decaddrinfo(a);
      if (a == (rnndecaddrinfo *)0x0) goto LAB_00102909;
      lVar6 = lVar6 + 1;
      puVar5 = puVar5 + 4;
    } while (lVar6 < (int)__ptr[0x2000]);
  }
  free(__ptr);
  return 0;
}

Assistant:

int
lookup_trace(const char *chipset, const char *event)
{
	struct trace *t;
	int i;

	if (decode_trace(chipset, event)) {
		fprintf(stderr, "Failed to decode trace using demmt!\n");
		return 1;
	}

	if (!(t = parse_trace(event)))
		return 1;

	for (i = 0; i < t->nb_ioctl; i++) {
		struct ioctl_call *c = &t->ioctls[i];

		printf("(%c) register: %06x, value: %08x, mask: %08x ",
		       (c->dir & 0x1 ? 'w' : 'r'), c->addr, c->value, c->mask);
		printf("%s ", (c->dir & 0x1 ? "<==" : "==>"));

		if (lookup(c->addr, c->value)) {
			fprintf(stderr, "Failed to decode addr using lookup!\n");
			return 1;
		}
	}
	free(t);

	return 0;
}